

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O0

void __thiscall
read_writecase::_impl<picnic_params_t>(read_writecase *this,anon_enum_32 *parameters)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  size_type sVar4;
  uchar *puVar5;
  undefined4 *in_RSI;
  picnic_privatekey_t sk2;
  int sk_written;
  picnic_publickey_t pk2;
  int pk_written;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  array<unsigned_char,_256UL> message;
  size_t signature_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  picnic_privatekey_t sk;
  picnic_publickey_t pk;
  size_t max_signature_size;
  context_frame context_frame_1120;
  lazy_ostream *in_stack_fffffffffffff4a8;
  lazy_ostream *in_stack_fffffffffffff4b0;
  undefined4 in_stack_fffffffffffff4b8;
  undefined4 in_stack_fffffffffffff4bc;
  const_string *this_00;
  size_type in_stack_fffffffffffff4c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff4d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  const_string *in_stack_fffffffffffff4e8;
  const_string *msg;
  lazy_ostream *in_stack_fffffffffffff4f0;
  const_string *in_stack_fffffffffffff4f8;
  const_string *file;
  lazy_ostream *in_stack_fffffffffffff500;
  lazy_ostream *in_stack_fffffffffffff530;
  undefined1 no_message;
  value_expr<const_unsigned_long_&> *in_stack_fffffffffffff538;
  array<unsigned_char,_256UL> *this_02;
  basic_cstring<const_char> local_990;
  basic_cstring<const_char> local_980;
  lazy_ostream local_970 [2];
  undefined1 local_94b;
  undefined1 in_stack_fffffffffffff6c7;
  shared_count in_stack_fffffffffffff6c8;
  basic_cstring<const_char> local_920;
  basic_cstring<const_char> local_910;
  basic_cstring<const_char> local_900;
  lazy_ostream local_8f0 [2];
  undefined1 local_8cb;
  assertion_result local_8c8;
  basic_cstring<const_char> local_8a0;
  undefined1 local_889 [97];
  basic_cstring<const_char> local_828;
  basic_cstring<const_char> local_818;
  lazy_ostream local_808 [2];
  size_type local_7e8;
  assertion_result local_7c0;
  basic_cstring<const_char> local_798;
  basic_cstring<const_char> local_788;
  basic_cstring<const_char> local_778;
  lazy_ostream local_768 [2];
  undefined4 local_748;
  assertion_result local_728;
  basic_cstring<const_char> local_700;
  undefined4 local_6ec;
  basic_cstring<const_char> local_6e8;
  basic_cstring<const_char> local_6d8;
  lazy_ostream local_6c8 [2];
  undefined1 local_6a3;
  assertion_result local_6a0;
  basic_cstring<const_char> local_678;
  basic_cstring<const_char> local_668;
  basic_cstring<const_char> local_658;
  lazy_ostream local_648 [2];
  undefined1 local_623;
  assertion_result local_620;
  basic_cstring<const_char> local_5f8;
  undefined1 local_5e1 [65];
  basic_cstring<const_char> local_5a0;
  basic_cstring<const_char> local_590;
  lazy_ostream local_580 [2];
  size_type local_560;
  assertion_result local_538;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  basic_cstring<const_char> local_4f0;
  lazy_ostream local_4e0 [2];
  undefined4 local_4c0;
  assertion_result local_4a0;
  basic_cstring<const_char> local_478;
  undefined4 local_464;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_460;
  basic_cstring<const_char> local_448;
  basic_cstring<const_char> local_438;
  lazy_ostream local_428 [2];
  undefined1 local_403;
  assertion_result local_400;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  basic_cstring<const_char> local_3b8;
  lazy_ostream local_3a8 [2];
  undefined1 local_383;
  assertion_result local_380;
  basic_cstring<const_char> local_358;
  array<unsigned_char,_256UL> local_348;
  undefined8 local_248 [4];
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  lazy_ostream local_208 [2];
  undefined1 local_1e3;
  assertion_result local_1e0;
  basic_cstring<const_char> local_1b8;
  undefined1 local_1a2 [97];
  undefined1 local_141 [65];
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  lazy_ostream local_e0 [3];
  assertion_result local_b0;
  basic_cstring<const_char> local_88;
  undefined8 local_78;
  undefined8 local_60;
  context_frame local_14;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
             (char (*) [16])in_stack_fffffffffffff4b0);
  local_60 = picnic_get_param_name(*local_10);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
             (char **)in_stack_fffffffffffff4b0);
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
              *)0x1cc6cf);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             0x1cc6dc);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_14);
  if (bVar1) {
    local_78 = picnic_signature_size(*local_10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (unsigned_long *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
                (in_stack_fffffffffffff538,SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f0,"max_signature_size",0x12);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_b0,local_e0,&local_100,0x72,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cc86b);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cc878);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      iVar2 = picnic_keygen(*local_10,local_141,local_1a2);
      local_1e3 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (bool *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_fffffffffffff538,
                 SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_218,"!picnic_keygen(parameters, &pk, &sk)",0x24);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_1e0,local_208,&local_228,0x76,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cca00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cca0d);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cca2f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    local_248[0] = local_78;
    (anonymous_namespace)::randomize_container<std::array<unsigned_char,256ul>>
              ((array<unsigned_char,_256UL> *)message._M_elems._96_8_);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_358,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      pvVar3 = std::array<unsigned_char,_256UL>::data((array<unsigned_char,_256UL> *)0x1ccad9);
      sVar4 = std::array<unsigned_char,_256UL>::size(&local_348);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ccb03);
      iVar2 = picnic_sign(local_1a2,pvVar3,sVar4,puVar5,local_248);
      local_383 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (bool *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_fffffffffffff538,
                 SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3b8,
                 "!picnic_sign(&sk, message.data(), message.size(), signature.data(), &signature_len)"
                 ,0x53);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_380,local_3a8,&local_3c8,0x7f,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1ccc28);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1ccc35);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      pvVar3 = std::array<unsigned_char,_256UL>::data((array<unsigned_char,_256UL> *)0x1cccb6);
      sVar4 = std::array<unsigned_char,_256UL>::size(&local_348);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ccce0);
      iVar2 = picnic_verify(local_141,pvVar3,sVar4,puVar5,local_248[0]);
      local_403 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (bool *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_fffffffffffff538,
                 SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_438,
                 "!picnic_verify(&pk, message.data(), message.size(), signature.data(), signature_len)"
                 ,0x54);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_448,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_400,local_428,&local_448,0x81,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cce05);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cce12);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cce2c);
    picnic_get_public_key_size(*local_10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message._M_elems._112_8_);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cce80);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_460);
    local_464 = picnic_write_public_key(local_141,puVar5,sVar4);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_478,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (int *)in_stack_fffffffffffff4b0);
      local_4c0 = 0;
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<int_const&>,int>::operator>
                ((expression_base<boost::test_tools::assertion::value_expr<const_int_&>,_int> *)
                 CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (int *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
                  *)in_stack_fffffffffffff6c8.pi_,(bool)in_stack_fffffffffffff6c7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_4f0,"pk_written > 0",0xe);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_500,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_4a0,local_4e0,&local_500,0x88,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cd02e);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cd03b);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_510,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (int *)in_stack_fffffffffffff4b0);
      local_560 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_460);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<int_const&>,int>::operator<=
                ((expression_base<boost::test_tools::assertion::value_expr<const_int_&>,_int> *)
                 CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (unsigned_long *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
                  *)in_stack_fffffffffffff6c8.pi_,(bool)in_stack_fffffffffffff6c7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_590,"pk_written <= buf.size()",0x18);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_5a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_538,local_580,&local_5a0,0x89,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cd1be);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cd1cb);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_5f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cd263);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_460);
      iVar2 = picnic_read_public_key(local_5e1,puVar5,sVar4);
      local_623 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (bool *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_fffffffffffff538,
                 SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_658,"!picnic_read_public_key(&pk2, buf.data(), buf.size())",0x35);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_668,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_620,local_648,&local_668,0x8d,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cd38d);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cd39a);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      no_message = (undefined1)((ulong)in_stack_fffffffffffff530 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_678,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      this_02 = &local_348;
      pvVar3 = std::array<unsigned_char,_256UL>::data((array<unsigned_char,_256UL> *)0x1cd41b);
      sVar4 = std::array<unsigned_char,_256UL>::size(this_02);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cd445);
      iVar2 = picnic_verify(local_5e1,pvVar3,sVar4,puVar5,local_248[0]);
      local_6a3 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (bool *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)this_02,(bool)no_message);
      in_stack_fffffffffffff530 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_6d8,
                 "!picnic_verify(&pk2, message.data(), message.size(), signature.data(), signature_len)"
                 ,0x55);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_6e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_6a0,local_6c8,&local_6e8,0x8f,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cd56a);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cd577);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    picnic_get_private_key_size(*local_10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message._M_elems._112_8_);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cd5d5);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_460);
    local_6ec = picnic_write_private_key(local_1a2,puVar5,sVar4);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_700,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (size_t)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (int *)in_stack_fffffffffffff4b0);
      local_748 = 0;
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<int_const&>,int>::operator>
                ((expression_base<boost::test_tools::assertion::value_expr<const_int_&>,_int> *)
                 CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (int *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
                  *)in_stack_fffffffffffff6c8.pi_,(bool)in_stack_fffffffffffff6c7);
      in_stack_fffffffffffff500 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_778,"sk_written > 0",0xe);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_788,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_728,local_768,&local_788,0x94,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cd768);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cd775);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_798,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,file,(size_t)in_stack_fffffffffffff4f0
                 ,in_stack_fffffffffffff4e8);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (int *)in_stack_fffffffffffff4b0);
      local_7e8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_460);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<int_const&>,int>::operator<=
                ((expression_base<boost::test_tools::assertion::value_expr<const_int_&>,_int> *)
                 CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (unsigned_long *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
                  *)in_stack_fffffffffffff6c8.pi_,(bool)in_stack_fffffffffffff6c7);
      in_stack_fffffffffffff4f0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_818,"sk_written <= buf.size()",0x18);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_828,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_7c0,local_808,&local_828,0x95,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cd8ec);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cd8f9);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    do {
      msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_8a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,file,(size_t)in_stack_fffffffffffff4f0
                 ,msg);
      this_01 = &local_460;
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cd988);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_01);
      iVar2 = picnic_read_private_key(local_889,puVar5,sVar4);
      local_8cb = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (bool *)in_stack_fffffffffffff4b0);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)this_02,SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_900,"!picnic_read_private_key(&sk2, buf.data(), buf.size())",0x36);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_910,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_8c8,local_8f0,&local_910,0x99,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cda9d);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cdaaa);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_920,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff500,file,(size_t)in_stack_fffffffffffff4f0
                 ,msg);
      iVar2 = picnic_validate_keypair(local_889,local_5e1);
      local_94b = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT44(iVar2,in_stack_fffffffffffff4b8),(bool *)in_stack_fffffffffffff4b0
                );
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)this_02,SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
      in_stack_fffffffffffff4b0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_980,"!picnic_validate_keypair(&sk2, &pk2)",0x24);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(iVar2,in_stack_fffffffffffff4b8),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_990,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xfffffffffffff6b8,local_970,&local_990,0x9a,CHECK,
                 CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cdc16);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cdc23);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1ce070);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(read_write, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature;
    signature.resize(max_signature_size);
    size_t signature_len = max_signature_size;

    std::array<uint8_t, 256> message;
    randomize_container(message);

    BOOST_TEST(!picnic_sign(&sk, message.data(), message.size(), signature.data(), &signature_len));
    BOOST_TEST(
        !picnic_verify(&pk, message.data(), message.size(), signature.data(), signature_len));

    std::vector<uint8_t> buf;
    buf.resize(picnic_get_public_key_size(parameters));
    randomize_container(buf);

    const auto pk_written = picnic_write_public_key(&pk, buf.data(), buf.size());
    BOOST_TEST(pk_written > 0);
    BOOST_TEST(pk_written <= buf.size());
    buf.resize(pk_written);

    picnic_publickey_t pk2;
    BOOST_TEST(!picnic_read_public_key(&pk2, buf.data(), buf.size()));
    BOOST_TEST(
        !picnic_verify(&pk2, message.data(), message.size(), signature.data(), signature_len));

    buf.resize(picnic_get_private_key_size(parameters));
    randomize_container(buf);
    const auto sk_written = picnic_write_private_key(&sk, buf.data(), buf.size());
    BOOST_TEST(sk_written > 0);
    BOOST_TEST(sk_written <= buf.size());
    buf.resize(sk_written);

    picnic_privatekey_t sk2;
    BOOST_TEST(!picnic_read_private_key(&sk2, buf.data(), buf.size()));
    BOOST_TEST(!picnic_validate_keypair(&sk2, &pk2));
  }
}